

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void DrawMatrix(uint16_t Xpos,uint16_t Ypos,uint16_t Width,uint16_t High,uint8_t *Matrix)

{
  double Gray;
  ushort local_20;
  ushort uStack_1e;
  uint8_t temp2;
  uint8_t temp1;
  uint8_t B;
  uint8_t G;
  uint8_t R;
  uint16_t y;
  uint16_t x;
  uint16_t j;
  uint16_t i;
  uint8_t *Matrix_local;
  uint16_t High_local;
  uint16_t Width_local;
  uint16_t Ypos_local;
  uint16_t Xpos_local;
  
  _temp1 = Ypos;
  for (local_20 = 0; local_20 < High; local_20 = local_20 + 1) {
    _G = Xpos;
    for (uStack_1e = 0; uStack_1e < Width; uStack_1e = uStack_1e + 1) {
      switch(bmp_BitCount) {
      case '\x01':
      case '\x04':
      case '\b':
        Gray._7_1_ = palette[Matrix[(int)((uint)local_20 * (uint)Width + (uint)uStack_1e)]].red;
        Gray._6_1_ = palette[Matrix[(int)((uint)local_20 * (uint)Width + (uint)uStack_1e)]].green;
        Gray._5_1_ = palette[Matrix[(int)((uint)local_20 * (uint)Width + (uint)uStack_1e)]].blue;
        break;
      default:
        break;
      case '\x10':
        Gray._7_1_ = (Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 2)] & 0x7c) <<
                     1;
        Gray._6_1_ = (byte)(((Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 2)] &
                             3) << 3 |
                            (int)(Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 2
                                              + 1)] & 0xe0) >> 5) << 3);
        Gray._5_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 2 + 1)] << 3;
        break;
      case '\x18':
        Gray._7_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 3)];
        Gray._6_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 3 + 1)];
        Gray._5_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 3 + 2)];
        break;
      case ' ':
        Gray._7_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 4)];
        Gray._6_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 4 + 1)];
        Gray._5_1_ = Matrix[(int)(((uint)local_20 * (uint)Width + (uint)uStack_1e) * 4 + 2)];
      }
      EPD_DrawPixel(_G,_temp1,
                    (uint8_t)(int)(double)(((uint)Gray._5_1_ * 0x72 + 500 +
                                           (uint)Gray._7_1_ * 299 + (uint)Gray._6_1_ * 0x24b) / 1000
                                          ));
      _G = _G + 1;
    }
    _temp1 = _temp1 + 1;
  }
  return;
}

Assistant:

static void DrawMatrix(uint16_t Xpos, uint16_t Ypos,uint16_t Width, uint16_t High,const uint8_t* Matrix)
{
	uint16_t i,j,x,y;
	uint8_t R,G,B;
	uint8_t temp1,temp2;
	double Gray;
	
	for (y=0,j=Ypos;y<High;y++,j++)
	{
 		for (x=0,i=Xpos;x<Width;x++,i++)
		{
			switch(bmp_BitCount)
			{
				case 1:
				case 4:
				case 8:
					R = palette[Matrix[(y*Width+x)]].red;
					G = palette[Matrix[(y*Width+x)]].green;
					B = palette[Matrix[(y*Width+x)]].blue;
				break;
				
				case 16:
					temp1 = Matrix[(y*Width+x)*2];
					temp2 = Matrix[(y*Width+x)*2+1];
					R = (temp1 & 0x7c)<<1;
					G = (((temp1 & 0x03) << 3 ) | ((temp2&0xe0) >> 5))<<3;
					B = (temp2 & 0x1f)<<3;
				break;
				
				case 24:
					R = Matrix[(y*Width+x)*3];
					G = Matrix[(y*Width+x)*3+1];
					B = Matrix[(y*Width+x)*3+2];
				break;
				
				case 32:
					R = Matrix[(y*Width+x)*4];
					G = Matrix[(y*Width+x)*4+1];
					B = Matrix[(y*Width+x)*4+2];
				break;
				
				default:
				break;
			}
		
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j, Gray);	
		}
	}
}